

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O0

void __thiscall
bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short>::find_leaves
          (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short> *this,sa_node_n x1,sa_node_n x2,
          uint64_t *m)

{
  sa_node_n x;
  sa_node_n x_00;
  sa_node_n x_01;
  sa_node_n x_02;
  sa_node_n x_03;
  sa_node_n x_04;
  sa_node_n x_05;
  sa_node_n x_06;
  sa_node_n x_07;
  sa_node_n x_08;
  sa_node_n x_09;
  sa_node_n x_10;
  sa_node_n x_11;
  sa_node_n x_12;
  sa_node_n x_13;
  sa_node_n x_14;
  sa_node_n x_15;
  sa_node_n x_16;
  sa_node_n x_17;
  sa_node_n x_18;
  sa_node_n x_19;
  sa_node_n x_20;
  sa_node_n x_21;
  sa_node_n x_22;
  sa_leaf L1_00;
  sa_leaf L1_01;
  sa_leaf L1_02;
  sa_leaf L1_03;
  sa_leaf L1_04;
  sa_leaf L2_00;
  sa_leaf L2_01;
  sa_leaf L2_02;
  sa_leaf L2_03;
  sa_leaf L2_04;
  sa_leaf L2_05;
  undefined1 auVar1 [24];
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t *in_RDI;
  range_t rVar6;
  uint64_t dummy_5;
  sa_leaf L2_5;
  sa_leaf L1_5;
  uint64_t dummy_4;
  sa_leaf L2_4;
  sa_leaf L1_4;
  uint64_t dummy_3;
  sa_leaf L2_3;
  sa_leaf L1_3;
  uint64_t dummy_2;
  sa_leaf L2_2;
  sa_leaf L1_2;
  uint64_t dummy_1;
  sa_leaf L2_1;
  sa_leaf L1_1;
  uint64_t dummy;
  sa_leaf L2;
  sa_leaf L1;
  undefined8 in_stack_fffffffffffff678;
  undefined8 in_stack_fffffffffffff680;
  uint64_t in_stack_fffffffffffff688;
  uint64_t *lcp_values;
  undefined1 compute_lcp;
  bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short> *in_stack_fffffffffffff6c0;
  unsigned_long in_stack_fffffffffffff6d0;
  unsigned_long in_stack_fffffffffffff6d8;
  uint64_t in_stack_fffffffffffff6e0;
  unsigned_long in_stack_fffffffffffff6e8;
  unsigned_long in_stack_fffffffffffff6f0;
  uint64_t in_stack_fffffffffffff6f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short> *local_8c8;
  undefined1 local_8b0 [24];
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  range_t local_870;
  ulong local_860;
  undefined1 local_858 [24];
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  range_t local_818;
  undefined1 local_808 [24];
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  range_t local_7c8;
  unsigned_long local_7b8;
  unsigned_long local_7b0;
  undefined8 local_7a8;
  unsigned_long local_7a0;
  unsigned_long local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined1 local_780 [24];
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  range_t local_740;
  undefined8 local_730;
  undefined1 local_728 [24];
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  range_t local_6e8;
  undefined8 local_6d8;
  undefined1 local_6d0 [24];
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  range_t local_690;
  undefined1 local_680 [24];
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  range_t local_640;
  unsigned_long local_630;
  unsigned_long local_628;
  undefined8 local_620;
  unsigned_long local_618;
  unsigned_long local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined1 local_5f8 [24];
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  range_t local_5b8;
  undefined8 local_5a8;
  undefined1 local_5a0 [24];
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  range_t local_560;
  undefined8 local_550;
  undefined1 local_548 [24];
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  range_t local_508;
  undefined1 local_4f8 [24];
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  range_t local_4b8;
  unsigned_long local_4a8;
  unsigned_long local_4a0;
  undefined8 local_498;
  unsigned_long local_490;
  unsigned_long local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined1 local_470 [24];
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  range_t local_430;
  undefined8 local_420;
  undefined1 local_418 [24];
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  range_t local_3d8;
  undefined8 local_3c8;
  undefined1 local_3c0 [24];
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  range_t local_380;
  undefined1 local_370 [24];
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  range_t local_330;
  unsigned_long local_320;
  unsigned_long local_318;
  undefined8 local_310;
  unsigned_long local_308;
  unsigned_long local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [24];
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  range_t local_2a8;
  undefined8 local_298;
  undefined1 local_290 [24];
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  range_t local_250;
  undefined8 local_240;
  undefined1 local_238 [24];
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  range_t local_1f8;
  undefined1 local_1e8 [24];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  range_t local_1a8;
  unsigned_long local_198;
  unsigned_long local_190;
  undefined8 local_188;
  unsigned_long local_180;
  unsigned_long local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined1 local_160 [24];
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  range_t local_120;
  undefined8 local_110;
  undefined1 local_108 [24];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  range_t local_c8;
  undefined8 local_b8;
  undefined1 local_b0 [24];
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  range_t local_70;
  undefined1 local_60 [24];
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  range_t local_20;
  
  lcp_values = (uint64_t *)&stack0x00000048;
  memcpy(local_60,&stack0x00000008,0x40);
  x.first_A = local_40;
  x.first_TERM = uStack_48;
  x.first_C = uStack_38;
  x.first_G = local_30;
  x.first_N = uStack_28;
  x.first_T = in_stack_fffffffffffff678;
  x.last = in_stack_fffffffffffff680;
  x.depth = in_stack_fffffffffffff688;
  local_20 = child_TERM(x);
  uVar2 = range_length(local_20);
  memcpy(local_b0,lcp_values,0x40);
  x_00.first_A = local_90;
  x_00.first_TERM = uStack_98;
  x_00.first_C = uStack_88;
  x_00.first_G = local_80;
  x_00.first_N = uStack_78;
  x_00.first_T = in_stack_fffffffffffff678;
  x_00.last = in_stack_fffffffffffff680;
  x_00.depth = in_stack_fffffffffffff688;
  local_70 = child_TERM(x_00);
  uVar3 = range_length(local_70);
  if (uVar2 + uVar3 == 1) {
    memcpy(local_108,&stack0x00000008,0x40);
    x_01.first_A = local_e8;
    x_01.first_TERM = uStack_f0;
    x_01.first_C = uStack_e0;
    x_01.first_G = local_d8;
    x_01.first_N = uStack_d0;
    x_01.first_T = in_stack_fffffffffffff678;
    x_01.last = in_stack_fffffffffffff680;
    x_01.depth = in_stack_fffffffffffff688;
    local_c8 = child_TERM(x_01);
    local_b8 = 0;
    memcpy(local_160,lcp_values,0x40);
    x_02.first_A = local_140;
    x_02.first_TERM = uStack_148;
    x_02.first_C = uStack_138;
    x_02.first_G = local_130;
    x_02.first_N = uStack_128;
    x_02.first_T = in_stack_fffffffffffff678;
    x_02.last = in_stack_fffffffffffff680;
    x_02.depth = in_stack_fffffffffffff688;
    local_120 = child_TERM(x_02);
    local_110 = 0;
    local_168 = 0;
    local_180 = local_c8.first;
    local_178 = local_c8.second;
    local_170 = local_b8;
    local_198 = local_120.first;
    local_190 = local_120.second;
    local_188 = 0;
    L1_00.rn.second = in_stack_fffffffffffff6d8;
    L1_00.rn.first = in_stack_fffffffffffff6d0;
    L1_00.depth = in_stack_fffffffffffff6e0;
    L2_00.rn.second = in_stack_fffffffffffff6f0;
    L2_00.rn.first = in_stack_fffffffffffff6e8;
    L2_00.depth = in_stack_fffffffffffff6f8;
    update_DA(in_stack_fffffffffffff6c0,L1_00,L2_00,SUB81(uVar2 >> 0x38,0),lcp_values,in_RDI);
  }
  compute_lcp = (undefined1)(uVar2 >> 0x38);
  memcpy(local_1e8,&stack0x00000008,0x40);
  x_03.first_A = local_1c8;
  x_03.first_TERM = uStack_1d0;
  x_03.first_C = uStack_1c0;
  x_03.first_G = local_1b8;
  x_03.first_N = uStack_1b0;
  x_03.first_T = in_stack_fffffffffffff678;
  x_03.last = in_stack_fffffffffffff680;
  x_03.depth = in_stack_fffffffffffff688;
  local_1a8 = child_A(x_03);
  uVar2 = range_length(local_1a8);
  memcpy(local_238,lcp_values,0x40);
  x_04.first_A = local_218;
  x_04.first_TERM = uStack_220;
  x_04.first_C = uStack_210;
  x_04.first_G = local_208;
  x_04.first_N = uStack_200;
  x_04.first_T = in_stack_fffffffffffff678;
  x_04.last = in_stack_fffffffffffff680;
  x_04.depth = in_stack_fffffffffffff688;
  local_1f8 = child_A(x_04);
  uVar3 = range_length(local_1f8);
  if (uVar2 + uVar3 == 1) {
    memcpy(local_290,&stack0x00000008,0x40);
    x_05.first_A = local_270;
    x_05.first_TERM = uStack_278;
    x_05.first_C = uStack_268;
    x_05.first_G = local_260;
    x_05.first_N = uStack_258;
    x_05.first_T = in_stack_fffffffffffff678;
    x_05.last = in_stack_fffffffffffff680;
    x_05.depth = in_stack_fffffffffffff688;
    local_250 = child_A(x_05);
    local_240 = 0;
    memcpy(local_2e8,lcp_values,0x40);
    x_06.first_A = local_2c8;
    x_06.first_TERM = uStack_2d0;
    x_06.first_C = uStack_2c0;
    x_06.first_G = local_2b8;
    x_06.first_N = uStack_2b0;
    x_06.first_T = in_stack_fffffffffffff678;
    x_06.last = in_stack_fffffffffffff680;
    x_06.depth = in_stack_fffffffffffff688;
    local_2a8 = child_A(x_06);
    local_298 = 0;
    local_2f0 = 0;
    local_308 = local_250.first;
    local_300 = local_250.second;
    local_2f8 = local_240;
    local_320 = local_2a8.first;
    local_318 = local_2a8.second;
    local_310 = 0;
    L1_01.rn.second = in_stack_fffffffffffff6d8;
    L1_01.rn.first = in_stack_fffffffffffff6d0;
    L1_01.depth = in_stack_fffffffffffff6e0;
    L2_01.rn.second = in_stack_fffffffffffff6f0;
    L2_01.rn.first = in_stack_fffffffffffff6e8;
    L2_01.depth = in_stack_fffffffffffff6f8;
    update_DA(in_stack_fffffffffffff6c0,L1_01,L2_01,(bool)compute_lcp,lcp_values,in_RDI);
  }
  memcpy(local_370,&stack0x00000008,0x40);
  x_07.first_A = local_350;
  x_07.first_TERM = uStack_358;
  x_07.first_C = uStack_348;
  x_07.first_G = local_340;
  x_07.first_N = uStack_338;
  x_07.first_T = in_stack_fffffffffffff678;
  x_07.last = in_stack_fffffffffffff680;
  x_07.depth = in_stack_fffffffffffff688;
  local_330 = child_C(x_07);
  uVar2 = range_length(local_330);
  memcpy(local_3c0,lcp_values,0x40);
  x_08.first_A = local_3a0;
  x_08.first_TERM = uStack_3a8;
  x_08.first_C = uStack_398;
  x_08.first_G = local_390;
  x_08.first_N = uStack_388;
  x_08.first_T = in_stack_fffffffffffff678;
  x_08.last = in_stack_fffffffffffff680;
  x_08.depth = in_stack_fffffffffffff688;
  local_380 = child_C(x_08);
  uVar3 = range_length(local_380);
  if (uVar2 + uVar3 == 1) {
    memcpy(local_418,&stack0x00000008,0x40);
    x_09.first_A = local_3f8;
    x_09.first_TERM = uStack_400;
    x_09.first_C = uStack_3f0;
    x_09.first_G = local_3e8;
    x_09.first_N = uStack_3e0;
    x_09.first_T = in_stack_fffffffffffff678;
    x_09.last = in_stack_fffffffffffff680;
    x_09.depth = in_stack_fffffffffffff688;
    local_3d8 = child_C(x_09);
    local_3c8 = 0;
    memcpy(local_470,lcp_values,0x40);
    x_10.first_A = local_450;
    x_10.first_TERM = uStack_458;
    x_10.first_C = uStack_448;
    x_10.first_G = local_440;
    x_10.first_N = uStack_438;
    x_10.first_T = in_stack_fffffffffffff678;
    x_10.last = in_stack_fffffffffffff680;
    x_10.depth = in_stack_fffffffffffff688;
    local_430 = child_C(x_10);
    local_420 = 0;
    local_478 = 0;
    local_490 = local_3d8.first;
    local_488 = local_3d8.second;
    local_480 = local_3c8;
    local_4a8 = local_430.first;
    local_4a0 = local_430.second;
    local_498 = 0;
    L1_02.rn.second = in_stack_fffffffffffff6d8;
    L1_02.rn.first = in_stack_fffffffffffff6d0;
    L1_02.depth = in_stack_fffffffffffff6e0;
    L2_02.rn.second = in_stack_fffffffffffff6f0;
    L2_02.rn.first = in_stack_fffffffffffff6e8;
    L2_02.depth = in_stack_fffffffffffff6f8;
    update_DA(in_stack_fffffffffffff6c0,L1_02,L2_02,(bool)compute_lcp,lcp_values,in_RDI);
  }
  memcpy(local_4f8,&stack0x00000008,0x40);
  x_11.first_A = local_4d8;
  x_11.first_TERM = uStack_4e0;
  x_11.first_C = uStack_4d0;
  x_11.first_G = local_4c8;
  x_11.first_N = uStack_4c0;
  x_11.first_T = in_stack_fffffffffffff678;
  x_11.last = in_stack_fffffffffffff680;
  x_11.depth = in_stack_fffffffffffff688;
  local_4b8 = child_G(x_11);
  uVar2 = range_length(local_4b8);
  memcpy(local_548,lcp_values,0x40);
  x_12.first_A = local_528;
  x_12.first_TERM = uStack_530;
  x_12.first_C = uStack_520;
  x_12.first_G = local_518;
  x_12.first_N = uStack_510;
  x_12.first_T = in_stack_fffffffffffff678;
  x_12.last = in_stack_fffffffffffff680;
  x_12.depth = uVar2;
  local_508 = child_G(x_12);
  uVar3 = range_length(local_508);
  if (uVar2 + uVar3 == 1) {
    memcpy(local_5a0,&stack0x00000008,0x40);
    x_13.first_A = local_580;
    x_13.first_TERM = uStack_588;
    x_13.first_C = uStack_578;
    x_13.first_G = local_570;
    x_13.first_N = uStack_568;
    x_13.first_T = in_stack_fffffffffffff678;
    x_13.last = in_stack_fffffffffffff680;
    x_13.depth = uVar2;
    local_560 = child_G(x_13);
    local_550 = 0;
    memcpy(local_5f8,lcp_values,0x40);
    x_14.first_A = local_5d8;
    x_14.first_TERM = uStack_5e0;
    x_14.first_C = uStack_5d0;
    x_14.first_G = local_5c8;
    x_14.first_N = uStack_5c0;
    x_14.first_T = in_stack_fffffffffffff678;
    x_14.last = in_stack_fffffffffffff680;
    x_14.depth = uVar2;
    local_5b8 = child_G(x_14);
    local_5a8 = 0;
    local_600 = 0;
    local_618 = local_560.first;
    local_610 = local_560.second;
    local_608 = local_550;
    local_630 = local_5b8.first;
    local_628 = local_5b8.second;
    local_620 = 0;
    L1_03.rn.second = in_stack_fffffffffffff6d8;
    L1_03.rn.first = in_stack_fffffffffffff6d0;
    L1_03.depth = in_stack_fffffffffffff6e0;
    L2_03.rn.second = in_stack_fffffffffffff6f0;
    L2_03.rn.first = in_stack_fffffffffffff6e8;
    L2_03.depth = in_stack_fffffffffffff6f8;
    update_DA(in_stack_fffffffffffff6c0,L1_03,L2_03,(bool)compute_lcp,lcp_values,in_RDI);
  }
  memcpy(local_680,&stack0x00000008,0x40);
  x_15.first_A = local_660;
  x_15.first_TERM = uStack_668;
  x_15.first_C = uStack_658;
  x_15.first_G = local_650;
  x_15.first_N = uStack_648;
  x_15.first_T = in_stack_fffffffffffff678;
  x_15.last = in_stack_fffffffffffff680;
  x_15.depth = uVar2;
  local_640 = child_N(x_15);
  uVar3 = range_length(local_640);
  memcpy(local_6d0,lcp_values,0x40);
  x_16.first_A = local_6b0;
  x_16.first_TERM = uStack_6b8;
  x_16.first_C = uStack_6a8;
  x_16.first_G = local_6a0;
  x_16.first_N = uStack_698;
  x_16.first_T = in_stack_fffffffffffff678;
  x_16.last = uVar3;
  x_16.depth = uVar2;
  local_690 = child_N(x_16);
  uVar4 = range_length(local_690);
  if (uVar3 + uVar4 == 1) {
    memcpy(local_728,&stack0x00000008,0x40);
    x_17.first_A = local_708;
    x_17.first_TERM = uStack_710;
    x_17.first_C = uStack_700;
    x_17.first_G = local_6f8;
    x_17.first_N = uStack_6f0;
    x_17.first_T = in_stack_fffffffffffff678;
    x_17.last = uVar3;
    x_17.depth = uVar2;
    local_6e8 = child_N(x_17);
    local_6d8 = 0;
    memcpy(local_780,lcp_values,0x40);
    x_18.first_A = local_760;
    x_18.first_TERM = uStack_768;
    x_18.first_C = uStack_758;
    x_18.first_G = local_750;
    x_18.first_N = uStack_748;
    x_18.first_T = in_stack_fffffffffffff678;
    x_18.last = uVar3;
    x_18.depth = uVar2;
    local_740 = child_N(x_18);
    local_730 = 0;
    local_788 = 0;
    local_7a0 = local_6e8.first;
    local_798 = local_6e8.second;
    local_790 = local_6d8;
    local_7b8 = local_740.first;
    local_7b0 = local_740.second;
    local_7a8 = 0;
    L1_04.rn.second = in_stack_fffffffffffff6d8;
    L1_04.rn.first = in_stack_fffffffffffff6d0;
    L1_04.depth = in_stack_fffffffffffff6e0;
    L2_04.rn.second = in_stack_fffffffffffff6f0;
    L2_04.rn.first = in_stack_fffffffffffff6e8;
    L2_04.depth = in_stack_fffffffffffff6f8;
    update_DA(in_stack_fffffffffffff6c0,L1_04,L2_04,(bool)compute_lcp,lcp_values,in_RDI);
  }
  memcpy(local_808,&stack0x00000008,0x40);
  x_19.first_A = local_7e8;
  x_19.first_TERM = uStack_7f0;
  x_19.first_C = uStack_7e0;
  x_19.first_G = local_7d8;
  x_19.first_N = uStack_7d0;
  x_19.first_T = in_stack_fffffffffffff678;
  x_19.last = uVar3;
  x_19.depth = uVar2;
  local_7c8 = child_T(x_19);
  uVar4 = range_length(local_7c8);
  memcpy(local_858,lcp_values,0x40);
  x_20.first_A = local_838;
  x_20.first_TERM = uStack_840;
  x_20.first_C = uStack_830;
  x_20.first_G = local_828;
  x_20.first_N = uStack_820;
  x_20.first_T = uVar4;
  x_20.last = uVar3;
  x_20.depth = uVar2;
  local_818 = child_T(x_20);
  uVar5 = range_length(local_818);
  if (uVar4 + uVar5 == 1) {
    memcpy(local_8b0,&stack0x00000008,0x40);
    x_21.first_A = local_890;
    x_21.first_TERM = uStack_898;
    x_21.first_C = uStack_888;
    x_21.first_G = local_880;
    x_21.first_N = uStack_878;
    x_21.first_T = uVar4;
    x_21.last = uVar3;
    x_21.depth = uVar2;
    local_870 = child_T(x_21);
    local_860 = 0;
    memcpy(&stack0xfffffffffffff6f8,lcp_values,0x40);
    x_22.first_A = local_8e8;
    x_22.first_TERM = uStack_8f0;
    x_22.first_C = uStack_8e0;
    x_22.first_G = local_8d8;
    x_22.first_N = uStack_8d0;
    x_22.first_T = uVar4;
    x_22.last = uVar3;
    x_22.depth = uVar2;
    rVar6 = child_T(x_22);
    local_8c8 = (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short> *)rVar6.first;
    auVar1._16_8_ = 0;
    auVar1._0_8_ = local_870.first;
    auVar1._8_8_ = local_870.second;
    L2_05.rn.second = 0;
    L2_05.rn.first = local_860;
    L2_05.depth = in_stack_fffffffffffff6f8;
    update_DA(local_8c8,(sa_leaf)(auVar1 << 0x40),L2_05,(bool)compute_lcp,lcp_values,in_RDI);
  }
  return;
}

Assistant:

void find_leaves(sa_node_n x1, sa_node_n x2, uint64_t & m){

		//find leaves that were ignored in the first pass
		if(range_length(child_TERM(x1))+range_length(child_TERM(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_TERM(x1),0};
			sa_leaf L2 = {child_TERM(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_A(x1))+range_length(child_A(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_A(x1),0};
			sa_leaf L2 = {child_A(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_C(x1))+range_length(child_C(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_C(x1),0};
			sa_leaf L2 = {child_C(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_G(x1))+range_length(child_G(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_G(x1),0};
			sa_leaf L2 = {child_G(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_N(x1))+range_length(child_N(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_N(x1),0};
			sa_leaf L2 = {child_N(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_T(x1))+range_length(child_T(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_T(x1),0};
			sa_leaf L2 = {child_T(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

	}